

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_propdef
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  long *in_RDI;
  vm_obj_id_t source_obj;
  vm_prop_id_t prop;
  int found;
  int flags;
  vm_val_t val;
  uint argc;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  CVmRun *in_stack_ffffffffffffff50;
  vm_val_t *in_stack_ffffffffffffff58;
  bool local_99;
  bool local_89;
  uint local_7c;
  vm_obj_id_t local_60;
  undefined2 local_5a;
  int local_58;
  undefined4 local_54;
  undefined1 local_50 [8];
  undefined4 local_48;
  uint local_3c;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  
  if (in_RCX == (uint *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = *in_RCX;
  }
  local_3c = local_7c;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                         ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_propdef::desc,1,1);
    __cxa_guard_release(&getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffff58,(uint *)in_stack_ffffffffffffff50,
                              (CVmNativeCodeDesc *)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (iVar1 == 0) {
    CVmRun::pop_prop(in_stack_ffffffffffffff50,
                     (vm_val_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_5a = (undefined2)local_48;
    if (local_3c < 2) {
      local_54 = 1;
    }
    else {
      CVmRun::pop_int(in_stack_ffffffffffffff50,
                      (vm_val_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_54 = local_48;
    }
    local_60 = 0;
    local_58 = (**(code **)(*in_RDI + 0x68))(in_RDI,local_5a,local_50,local_14,&local_60,0);
    if ((local_58 != 0) && (iVar1 = CVmObjIntClsMod::is_intcls_mod_obj(0), iVar1 != 0)) {
      local_60 = (**(code **)(*in_RDI + 0x1d0))(in_RDI,local_14,local_60);
    }
    switch(local_54) {
    case 1:
      vm_val_t::set_logical(local_20,local_58);
      break;
    case 2:
      local_89 = local_58 != 0 && local_60 == local_14;
      vm_val_t::set_logical(local_20,(uint)local_89);
      break;
    case 3:
      local_99 = local_58 != 0 && local_60 != local_14;
      vm_val_t::set_logical(local_20,(uint)local_99);
      break;
    case 4:
      if (local_58 == 0) {
        vm_val_t::set_nil(local_20);
      }
      else {
        if (local_60 != 0) {
          local_14 = local_60;
        }
        vm_val_t::set_obj(local_20,local_14);
      }
      break;
    default:
      err_throw(0);
    }
  }
  return 1;
}

Assistant:

int CVmObject::getp_propdef(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1, 1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 2)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = get_prop(vmg_ prop, &val, self, &source_obj, 0);

    /* 
     *   If we found a result, check to see if it's an intrinsic class
     *   modifier object.  If it is, replace it with its intrinsic class:
     *   modifier objects are invisible through the reflection mechanism, and
     *   appear to be the actual intrinsic classes they modify.  
     */
    if (found && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ source_obj))
        source_obj = find_intcls_for_mod(vmg_ self, source_obj);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_DIRECTLY:
        /* return true if the property is defined directly */
        retval->set_logical(found && source_obj == self);
        break;
        
    case VMOBJ_PROPDEF_INHERITS:
        /* return true if the property is inherited only */
        retval->set_logical(found && source_obj != self);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* 
             *   If we got a valid source object, return it.  If we didn't
             *   get a valid source object, but we found the property,
             *   return 'self' as the result; this isn't exactly right, but
             *   this should only be possible when the source object is an
             *   intrinsic class for which no intrinsic class object is
             *   defined, in which case the best we can do is provide 'self'
             *   as the answer.  
             */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }